

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BS_thread_pool.hpp
# Opt level: O3

void __thiscall
BS::thread_pool<(unsigned_char)'\x00'>::worker
          (thread_pool<(unsigned_char)__x00_> *this,stop_token *stop_token,size_t idx)

{
  _Stop_state_t *p_Var1;
  size_t sVar2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  unique_lock<std::mutex> tasks_lock;
  task_t task;
  _Stop_state_ref local_80;
  unique_lock<std::mutex> local_78;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  void *local_48;
  condition_variable *local_40;
  mutex *local_38;
  
  if (*(char *)(in_FS_OFFSET + -0x50) == '\0') {
    *(undefined1 *)(in_FS_OFFSET + -0x50) = 1;
  }
  *(thread_pool<(unsigned_char)__x00_> **)(in_FS_OFFSET + -0x58) = this;
  *(size_t *)(in_FS_OFFSET + -0x48) = idx;
  *(undefined1 *)(in_FS_OFFSET + -0x40) = 1;
  local_48 = (void *)idx;
  if ((this->init_func).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_00182e03:
    local_68._M_unused._M_object = local_48;
    uVar3 = std::__throw_bad_function_call();
  }
  else {
    local_68._M_unused._M_member_pointer = idx;
    (*(this->init_func)._M_invoker)
              ((_Any_data *)&this->init_func,(unsigned_long *)local_68._M_pod_data);
    local_38 = &this->tasks_mutex;
    local_40 = &this->tasks_done_cv;
    while( true ) {
      local_78._M_device = local_38;
      local_78._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_78);
      local_78._M_owns = true;
      sVar2 = this->tasks_running - 1;
      this->tasks_running = sVar2;
      if (((sVar2 == 0 & this->waiting) == 1) &&
         ((this->tasks).c.
          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur ==
          (this->tasks).c.
          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
          _M_impl.super__Deque_impl_data._M_start._M_cur)) {
        std::condition_variable::notify_all();
      }
      local_80._M_ptr = (stop_token->_M_state)._M_ptr;
      if (local_80._M_ptr != (_Stop_state_t *)0x0) {
        LOCK();
        ((local_80._M_ptr)->_M_owners).super___atomic_base<unsigned_int>._M_i =
             ((local_80._M_ptr)->_M_owners).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
      }
      std::_V2::condition_variable_any::
      wait<std::unique_lock<std::mutex>,BS::thread_pool<(unsigned_char)0>::worker(std::stop_token_const&,unsigned_long)::_lambda()_1_>
                (&this->task_available_cv,&local_78,(stop_token *)&local_80,
                 (anon_class_8_1_8991fb9c)this);
      if (local_80._M_ptr != (_Stop_state_t *)0x0) {
        LOCK();
        ((local_80._M_ptr)->_M_owners).super___atomic_base<unsigned_int>._M_i =
             ((local_80._M_ptr)->_M_owners).super___atomic_base<unsigned_int>._M_i - 1;
        UNLOCK();
        if (((local_80._M_ptr)->_M_owners).super___atomic_base<unsigned_int>._M_i == 0) {
          operator_delete(local_80._M_ptr,0x18);
        }
      }
      p_Var1 = (stop_token->_M_state)._M_ptr;
      if ((p_Var1 != (_Stop_state_t *)0x0) &&
         (((p_Var1->_M_value).super___atomic_base<unsigned_int>._M_i & 1) != 0)) {
        std::unique_lock<std::mutex>::~unique_lock(&local_78);
        local_68._M_unused._M_object = local_48;
        if ((this->cleanup_func).super__Function_base._M_manager != (_Manager_type)0x0) {
          (*(this->cleanup_func)._M_invoker)
                    ((_Any_data *)this,(unsigned_long *)local_68._M_pod_data);
          if (*(char *)(in_FS_OFFSET + -0x40) == '\x01') {
            *(undefined1 *)(in_FS_OFFSET + -0x40) = 0;
          }
          if (*(char *)(in_FS_OFFSET + -0x50) == '\x01') {
            *(undefined1 *)(in_FS_OFFSET + -0x50) = 0;
          }
          return;
        }
        goto LAB_00182e03;
      }
      local_58 = (code *)0x0;
      pcStack_50 = (code *)0x0;
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = 0;
      std::function<void_()>::operator=
                ((function<void_()> *)&local_68,
                 (this->tasks).c.
                 super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur);
      std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::pop_front
                (&(this->tasks).c);
      this->tasks_running = this->tasks_running + 1;
      std::unique_lock<std::mutex>::unlock(&local_78);
      if (local_58 == (code *)0x0) break;
      (*pcStack_50)(&local_68);
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,__destroy_functor);
      }
      std::unique_lock<std::mutex>::~unique_lock(&local_78);
    }
    uVar3 = std::__throw_bad_function_call();
  }
  __clang_call_terminate(uVar3);
}

Assistant:

void worker(BS_THREAD_POOL_WORKER_TOKEN const std::size_t idx)
    {
        this_thread::my_pool = this;
        this_thread::my_index = idx;
        init_func(idx);
        while (true)
        {
            std::unique_lock tasks_lock(tasks_mutex);
            --tasks_running;
            if constexpr (pause_enabled)
            {
                if (waiting && (tasks_running == 0) && (paused || tasks.empty()))
                    tasks_done_cv.notify_all();
            }
            else
            {
                if (waiting && (tasks_running == 0) && tasks.empty())
                    tasks_done_cv.notify_all();
            }
            task_available_cv.wait(tasks_lock BS_THREAD_POOL_WAIT_TOKEN,
                [this]
                {
                    if constexpr (pause_enabled)
                        return !(paused || tasks.empty()) BS_THREAD_POOL_OR_STOP_CONDITION;
                    else
                        return !tasks.empty() BS_THREAD_POOL_OR_STOP_CONDITION;
                });
            if (BS_THREAD_POOL_STOP_CONDITION)
                break;
            {
                task_t task = pop_task(); // NOLINT(misc-const-correctness) In C++23 this cannot be const since `std::move_only_function::operator()` is not a const member function.
                ++tasks_running;
                tasks_lock.unlock();
#ifdef __cpp_exceptions
                try
                {
#endif
                    task();
#ifdef __cpp_exceptions
                }
                catch (...)
                {
                }
#endif
            }
        }
        cleanup_func(idx);
        this_thread::my_index = std::nullopt;
        this_thread::my_pool = std::nullopt;
    }